

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void Js::SegmentBTree::InsertNonFullNode
               (Recycler *recycler,SegmentBTree *node,SparseArraySegmentBase *newSeg)

{
  ulong uVar1;
  Type *addr;
  SegmentBTree *pSVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Recycler *pRVar7;
  SparseArraySegmentBase **ppSVar8;
  uint *puVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  data._32_8_ = recycler;
  do {
    if (node->segmentCount == 0x27) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x135,"(!node->IsFullNode())","!node->IsFullNode()");
      if (!bVar4) goto LAB_00b78e07;
      *puVar6 = 0;
    }
    if (0x26 < node->segmentCount) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x136,"(node->segmentCount < MaxKeys)",
                                  "node->segmentCount < MaxKeys");
      if (!bVar4) goto LAB_00b78e07;
      *puVar6 = 0;
    }
    if (newSeg == (SparseArraySegmentBase *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x137,"(newSeg != __null)","newSeg != NULL");
      if (!bVar4) goto LAB_00b78e07;
      *puVar6 = 0;
    }
    pSVar2 = (node->children).ptr;
    uVar11 = node->segmentCount;
    uVar12 = (ulong)uVar11;
    if (pSVar2 == (SegmentBTree *)0x0) {
      if (uVar11 == 0) goto LAB_00b78ba3;
      break;
    }
    uVar11 = uVar11 + 1;
    do {
      bVar4 = uVar12 == 0;
      uVar12 = uVar12 - 1;
      if (bVar4) {
        uVar11 = 0;
        break;
      }
      uVar11 = uVar11 - 1;
    } while (newSeg->left < (node->keys).ptr[uVar12]);
    if (pSVar2[uVar11].segmentCount == 0x27) {
      SplitChild((Recycler *)data._32_8_,node,uVar11,pSVar2 + uVar11);
      if ((node->keys).ptr[uVar11] != (node->segments).ptr[uVar11]->left) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x15e,"(node->keys[i] == node->segments[i]->left)",
                                    "node->keys[i] == node->segments[i]->left");
        if (!bVar4) goto LAB_00b78e07;
        *puVar6 = 0;
      }
      uVar11 = uVar11 + ((node->keys).ptr[uVar11] < newSeg->left);
    }
    node = (node->children).ptr + uVar11;
  } while( true );
  while( true ) {
    ppSVar8 = (node->segments).ptr;
    ppSVar8[uVar12] = ppSVar8[uVar10];
    puVar9 = (node->keys).ptr;
    puVar9[uVar12] = puVar9[uVar10];
    uVar12 = uVar1;
    if ((int)uVar1 == 0) break;
    uVar1 = uVar12 - 1;
    uVar10 = uVar1 & 0xffffffff;
    if ((node->keys).ptr[uVar10] <= newSeg->left) goto LAB_00b78ba3;
  }
  uVar12 = 0;
LAB_00b78ba3:
  if ((node->segments).ptr == (SparseArraySegmentBase **)0x0) {
    local_60 = (undefined1  [8])&SparseArraySegmentBase*::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0x27;
    data.count = (size_t)anon_var_dwarf_6adf93b;
    data.filename._0_4_ = 0x147;
    pRVar7 = Memory::Recycler::TrackAllocInfo((Recycler *)data._32_8_,(TrackAllocData *)local_60);
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_00b78e07;
      *puVar6 = 0;
    }
    ppSVar8 = (SparseArraySegmentBase **)
              Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                        (pRVar7,0x138);
    if (ppSVar8 == (SparseArraySegmentBase **)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) goto LAB_00b78e07;
      *puVar6 = 0;
    }
    addr = &node->segments;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = ppSVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    local_60 = (undefined1  [8])&unsigned_int::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0x27;
    data.count = (size_t)anon_var_dwarf_6adf93b;
    data.filename._0_4_ = 0x148;
    pRVar7 = Memory::Recycler::TrackAllocInfo((Recycler *)data._32_8_,(TrackAllocData *)local_60);
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_00b78e07;
      *puVar6 = 0;
    }
    puVar9 = (uint *)Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                               (pRVar7,0x9c);
    if (puVar9 == (uint *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) {
LAB_00b78e07:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    Memory::Recycler::WBSetBit((char *)node);
    (node->keys).ptr = puVar9;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(node);
  }
  (node->segments).ptr[uVar12 & 0xffffffff] = newSeg;
  (node->keys).ptr[uVar12 & 0xffffffff] = newSeg->left;
  node->segmentCount = node->segmentCount + 1;
  return;
}

Assistant:

void SegmentBTree::InsertNonFullNode(Recycler* recycler, SegmentBTree* node, SparseArraySegmentBase* newSeg)
    {
        Assert(!node->IsFullNode());
        AnalysisAssert(node->segmentCount < MaxKeys);       // Same as !node->IsFullNode()
        Assert(newSeg != NULL);

        if (node->IsLeaf())
        {
            // Move the keys
            uint32 i = node->segmentCount - 1;
            while( (i != -1) && (newSeg->left < node->keys[i]))
            {
                node->segments[i+1] = node->segments[i];
                node->keys[i+1] = node->keys[i];
                i--;
            }
            if (!node->segments)
            {
                // Even though the segments point to a GC pointer, the main array should keep a references
                // as well.  So just make it a leaf allocation
                node->segments = AllocatorNewArrayLeafZ(Recycler, recycler, SparseArraySegmentBase*, MaxKeys);
                node->keys = AllocatorNewArrayLeafZ(Recycler, recycler, uint32, MaxKeys);
            }
            node->segments[i + 1] = newSeg;
            node->keys[i + 1] = newSeg->left;
            node->segmentCount++;
        }
        else
        {
            // find the correct child node
            uint32 i = node->segmentCount-1;

            while((i != -1) && (newSeg->left < node->keys[i]))
            {
                i--;
            }
            i++;

            // Make room if full
            if(node->children[i].IsFullNode())
            {
                // This split doesn't make the tree any deeper as node already has children.
                SplitChild(recycler, node, i, node->children+i);
                Assert(node->keys[i] == node->segments[i]->left);
                if (newSeg->left > node->keys[i])
                {
                    i++;
                }
            }
            InsertNonFullNode(recycler, node->children+i, newSeg);
        }
    }